

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_sv.c
# Opt level: O0

void dtl_sv_destroy(dtl_sv_t *self)

{
  dtl_sv_type_id dVar1;
  dtl_sv_t *self_local;
  
  if (self != (dtl_sv_t *)0x0) {
    dVar1 = dtl_sv_type(self);
    switch(dVar1) {
    case DTL_SV_STR:
      adt_str_delete((self->pAny->val).str);
      break;
    case DTL_SV_PTR:
      if ((self->pAny->val).ptr.pDestructor != (apx_void_ptr_func_t *)0x0) {
        (*(self->pAny->val).ptr.pDestructor)((void *)(self->pAny->val).i64);
      }
      break;
    case DTL_SV_DV:
      if ((self->pAny->val).i64 != 0) {
        dtl_dv_dec_ref((self->pAny->val).dv);
      }
      break;
    case DTL_SV_BYTES:
      adt_bytes_delete((self->pAny->val).bytes);
      break;
    case DTL_SV_BYTEARRAY:
      adt_bytearray_delete((self->pAny->val).bytearray);
    }
    if (self->pAny->tmpStr != (adt_str_t *)0x0) {
      adt_str_delete(self->pAny->tmpStr);
      self->pAny->tmpStr = (adt_str_t *)0x0;
    }
    free(self->pAny);
    self->pAny = (dtl_svx_t *)0x0;
  }
  return;
}

Assistant:

void dtl_sv_destroy(dtl_sv_t* self)
{
   if(self != 0)
   {
      switch(dtl_sv_type(self))
      {
      case DTL_SV_STR:
         adt_str_delete(self->pAny->val.str);
         break;
      case DTL_SV_PTR:
         if(self->pAny->val.ptr.pDestructor != 0)
         {
            self->pAny->val.ptr.pDestructor(self->pAny->val.ptr.p);
         }
         break;
      case DTL_SV_DV:
         if(self->pAny->val.dv != 0)
         {
            dtl_dv_dec_ref(self->pAny->val.dv);
         }
         break;
      case DTL_SV_BYTES:
         adt_bytes_delete(self->pAny->val.bytes);
         break;
      case DTL_SV_BYTEARRAY:
         adt_bytearray_delete(self->pAny->val.bytearray);
         break;
      default:
         break;
      }
      if (self->pAny->tmpStr != 0)
      {
         adt_str_delete(self->pAny->tmpStr);
         self->pAny->tmpStr = (adt_str_t*) 0;
      }
      free(self->pAny);
      self->pAny = 0;
   }
}